

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spin_mutex.c
# Opt level: O0

void spin_mutex_lock(spin_mutex *m)

{
  int iVar1;
  int *in_RDI;
  int maxspin;
  int count;
  undefined4 local_c;
  
  iVar1 = __cilkrts_xchg(in_RDI,1);
  if (iVar1 != 0) {
    local_c = 0;
    do {
      __cilkrts_short_pause();
      local_c = local_c + 1;
      if (999 < local_c) {
        __cilkrts_yield();
        local_c = 0;
      }
    } while ((*in_RDI != 0) || (iVar1 = __cilkrts_xchg(in_RDI,1), iVar1 != 0));
  }
  return;
}

Assistant:

void spin_mutex_lock(struct spin_mutex *m)
{
    int count;
    const int maxspin = 1000; /* SWAG */
    if (!TRY_ACQUIRE(m)) {
        count = 0;
        do {
            do {
                __cilkrts_short_pause();
                if (++count >= maxspin) {
                    /* let the OS reschedule every once in a while */
                    __cilkrts_yield();
                    count = 0;
                }
            } while (m->lock != 0);
        } while (!TRY_ACQUIRE(m));
    }
}